

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsTorqueConverter::IntLoadResidual_F
          (ChShaftsTorqueConverter *this,uint off,ChVectorDynamic<> *R,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  Scalar *pSVar6;
  undefined4 in_register_00000034;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar5 = (*(this->shaft1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])
                    (this->shaft1,CONCAT44(in_register_00000034,off));
  if ((char)iVar5 != '\0') {
    dVar1 = this->torque_in;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(this->shaft1->super_ChPhysicsItem).offset_w);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = c;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *pSVar6;
    auVar7 = vfmadd213sd_fma(auVar12,auVar8,auVar7);
    *pSVar6 = auVar7._0_8_;
  }
  iVar5 = (*(this->shaft2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    dVar1 = this->torque_out;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(this->shaft2->super_ChPhysicsItem).offset_w);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = c;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar6;
    auVar7 = vfmadd213sd_fma(auVar13,auVar9,auVar2);
    *pSVar6 = auVar7._0_8_;
  }
  iVar5 = (*(this->shaft_stator->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = this->torque_out;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar10,auVar4);
    dVar1 = this->torque_in;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(this->shaft_stator->super_ChPhysicsItem).offset_w);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = c;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar7._0_8_ - dVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pSVar6;
    auVar7 = vfmadd213sd_fma(auVar11,auVar14,auVar3);
    *pSVar6 = auVar7._0_8_;
  }
  return;
}

Assistant:

void ChShaftsTorqueConverter::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                                ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                                const double c           // a scaling factor
) {
    if (shaft1->IsActive())
        R(shaft1->GetOffset_w()) += torque_in * c;
    if (shaft2->IsActive())
        R(shaft2->GetOffset_w()) += torque_out * c;
    if (shaft_stator->IsActive())
        R(shaft_stator->GetOffset_w()) += GetTorqueReactionOnStator() * c;
}